

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receptor.cpp
# Opt level: O0

void __thiscall indk::Neuron::Receptor::doReset(Receptor *this)

{
  Receptor *this_local;
  
  std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::clear(&this->CPf);
  this->Rs = 0.01;
  this->Lf = 0.0;
  this->Fi = 0.0;
  this->dFi = 0.0;
  std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::clear(&this->ReferencePos);
  Position::setPosition(this->PhantomPos,this->DefaultPos);
  this->Locked = false;
  return;
}

Assistant:

void indk::Neuron::Receptor::doReset() {
    CPf.clear();
    Rs = 0.01;
    Lf = 0;
    Fi = 0;
    dFi = 0;
    ReferencePos.clear();
    PhantomPos -> setPosition(DefaultPos);
    Locked = false;
}